

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool tdefl_compress_normal(tdefl_compressor *d)

{
  mz_uint *pmVar1;
  mz_uint8 *pmVar2;
  long lVar3;
  mz_uint16 *pmVar4;
  byte bVar5;
  byte bVar6;
  short sVar7;
  ushort uVar8;
  tdefl_flush tVar9;
  uint uVar10;
  mz_uint8 *pmVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  int iVar17;
  short sVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  mz_uint mVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  short sVar29;
  uint uVar30;
  uint uVar31;
  byte *pbVar32;
  uint local_9c;
  size_t local_98;
  int local_48;
  int local_40;
  
  pbVar32 = d->m_pSrc;
  local_98 = d->m_src_buf_left;
  tVar9 = d->m_flush;
  pmVar2 = d->m_dict;
  local_40 = (int)d + 0x92aa;
  do {
    pbVar15 = pbVar32;
    if (local_98 == 0) {
      if ((tVar9 == TDEFL_NO_FLUSH) || (uVar13 = d->m_lookahead_size, uVar13 == 0)) {
        local_98 = 0;
        goto LAB_0015bc87;
      }
      uVar14 = d->m_dict_size;
      uVar19 = uVar13;
      if (1 < uVar14 + uVar13) goto LAB_0015b390;
      local_98 = 0;
LAB_0015b5b7:
      uVar19 = 0x8000 - uVar13;
      if (uVar14 <= 0x8000 - uVar13) {
        uVar19 = uVar14;
      }
      d->m_dict_size = uVar19;
    }
    else {
      uVar19 = d->m_lookahead_size;
      uVar14 = d->m_dict_size;
      if (uVar14 + uVar19 < 2) {
        uVar13 = 0x102;
        if (0x102 < uVar19) {
          uVar13 = uVar19;
        }
        uVar24 = 0;
        do {
          iVar20 = (int)uVar24;
          if (uVar13 - uVar19 == iVar20) {
            pbVar32 = pbVar32 + uVar24;
            local_98 = local_98 - uVar24;
            goto LAB_0015b5b7;
          }
          bVar6 = pbVar32[uVar24];
          mVar22 = d->m_lookahead_pos;
          uVar30 = uVar19 + iVar20 + mVar22 & 0x7fff;
          d->m_dict[uVar30] = bVar6;
          if (uVar30 < 0x101) {
            d->m_dict[(ulong)uVar30 + 0x8000] = bVar6;
          }
          d->m_lookahead_size = uVar19 + iVar20 + 1;
          if (2 < uVar19 + uVar14 + 1 + iVar20) {
            uVar31 = (uVar19 - 2) + iVar20 + mVar22 & 0x7fff;
            uVar30 = (uint)bVar6 ^ (uint)d->m_dict[(mVar22 + uVar19 + iVar20) - 1 & 0x7fff] << 5 ^
                     (d->m_dict[uVar31] & 0x1f) << 10;
            d->m_next[uVar31] = d->m_hash[uVar30];
            d->m_hash[uVar30] = ((short)mVar22 + (short)(uVar19 + iVar20)) - 2;
          }
          uVar24 = uVar24 + 1;
        } while (local_98 != uVar24);
        uVar13 = uVar19 + (int)uVar24;
        local_98 = 0;
        pbVar15 = pbVar32 + uVar24;
      }
      else {
LAB_0015b390:
        mVar22 = d->m_lookahead_pos;
        uVar30 = (uVar19 + mVar22) - 2;
        bVar6 = d->m_dict[uVar30 & 0x7fff];
        bVar5 = d->m_dict[(mVar22 + uVar19) - 1 & 0x7fff];
        uVar24 = local_98 & 0xffffffff;
        if (0x102 - uVar19 <= local_98) {
          uVar24 = (ulong)(0x102 - uVar19);
        }
        local_98 = local_98 - uVar24;
        uVar13 = (int)uVar24 + uVar19;
        d->m_lookahead_size = uVar13;
        if ((int)uVar24 != 0) {
          uVar19 = mVar22 + uVar19;
          pbVar15 = pbVar32 + uVar24;
          uVar16 = (ulong)((uint)bVar6 << 5 ^ (uint)bVar5);
          do {
            uVar19 = uVar19 & 0x7fff;
            bVar6 = *pbVar32;
            pmVar2[uVar19] = bVar6;
            if (uVar19 < 0x101) {
              d->m_dict[(ulong)uVar19 + 0x8000] = bVar6;
            }
            pbVar32 = pbVar32 + 1;
            uVar16 = (ulong)(((uint)uVar16 & 0x3ff) << 5 ^ (uint)bVar6);
            d->m_next[uVar30 & 0x7fff] = d->m_hash[uVar16];
            d->m_hash[uVar16] = (mz_uint16)uVar30;
            uVar19 = uVar19 + 1;
            uVar30 = uVar30 + 1;
            uVar24 = uVar24 - 1;
          } while (uVar24 != 0);
        }
      }
      uVar19 = 0x8000 - uVar13;
      if (uVar14 <= 0x8000 - uVar13) {
        uVar19 = uVar14;
      }
      d->m_dict_size = uVar19;
      pbVar32 = pbVar15;
      if ((tVar9 == TDEFL_NO_FLUSH) && (uVar13 < 0x102)) {
LAB_0015bc87:
        d->m_pSrc = pbVar15;
        d->m_src_buf_left = local_98;
        return 1;
      }
    }
    uVar14 = d->m_saved_match_len;
    uVar30 = uVar14;
    if (uVar14 == 0) {
      uVar30 = 2;
    }
    uVar31 = d->m_flags;
    uVar10 = d->m_lookahead_pos;
    uVar28 = uVar10 & 0x7fff;
    uVar24 = (ulong)uVar28;
    if ((uVar31 & 0x90000) == 0) {
      if (0x102 < uVar13) {
        __assert_fail("max_match_len <= TDEFL_MAX_MATCH_LEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                      ,0x57a,
                      "void tdefl_find_match(tdefl_compressor *, mz_uint, mz_uint, mz_uint, mz_uint *, mz_uint *)"
                     );
      }
      if (uVar13 <= uVar30) goto LAB_0015b88a;
      local_48 = (int)pmVar2 + uVar28;
      mVar22 = d->m_max_probes[0x1f < uVar30];
      lVar3 = (long)d->m_max_probes + (uVar24 - 0x14);
      local_9c = 0;
      uVar16 = uVar24;
      do {
        sVar7 = *(short *)(pmVar2 + ((uVar28 - 1) + uVar30));
        iVar20 = uVar30 - 1;
LAB_0015b6c3:
        do {
          do {
            mVar22 = mVar22 - 1;
            uVar27 = local_9c;
            uVar23 = uVar30;
            if ((mVar22 == 0) || (uVar8 = d->m_next[uVar16], uVar8 == 0)) goto LAB_0015b8b3;
            uVar21 = uVar10 - uVar8;
            uVar26 = uVar21 & 0xffff;
            if (uVar19 < (uVar21 & 0xffff)) goto LAB_0015b8b3;
            uVar21 = uVar8 & 0x7fff;
            uVar16 = (ulong)uVar21;
            if (*(short *)(pmVar2 + (iVar20 + uVar21)) != sVar7) {
              uVar8 = d->m_next[uVar16];
              if (uVar8 == 0) goto LAB_0015b8b3;
              uVar21 = uVar10 - uVar8;
              uVar26 = uVar21 & 0xffff;
              if (uVar19 < (uVar21 & 0xffff)) goto LAB_0015b8b3;
              uVar21 = uVar8 & 0x7fff;
              uVar16 = (ulong)uVar21;
              if (*(short *)(pmVar2 + (iVar20 + uVar21)) != sVar7) {
                uVar8 = d->m_next[uVar16];
                if (uVar8 == 0) goto LAB_0015b8b3;
                uVar21 = uVar10 - uVar8;
                uVar26 = uVar21 & 0xffff;
                if (uVar19 < (uVar21 & 0xffff)) goto LAB_0015b8b3;
                uVar21 = uVar8 & 0x7fff;
                uVar16 = (ulong)uVar21;
                if (*(short *)(pmVar2 + (iVar20 + uVar21)) != sVar7) goto LAB_0015b6c3;
              }
            }
            if (uVar26 == 0) goto LAB_0015b8b3;
          } while (*(short *)(pmVar2 + uVar16) != *(short *)(pmVar2 + uVar24));
          lVar25 = 0;
          while( true ) {
            sVar18 = *(short *)(lVar3 + 0xca + lVar25);
            sVar29 = *(short *)(d->m_dict + lVar25 + uVar16 + 2);
            iVar17 = (int)lVar3;
            iVar12 = (int)lVar25;
            uVar27 = uVar26;
            if (sVar18 != sVar29) break;
            sVar18 = *(short *)(lVar3 + 0xcc + lVar25);
            sVar29 = *(short *)(d->m_dict + lVar25 + uVar16 + 4);
            if (sVar18 != sVar29) {
              iVar17 = iVar17 + iVar12 + 0xcc;
              goto LAB_0015b84d;
            }
            sVar18 = *(short *)(lVar3 + 0xce + lVar25);
            sVar29 = *(short *)(d->m_dict + lVar25 + uVar16 + 6);
            if (sVar18 != sVar29) {
              iVar17 = iVar17 + iVar12 + 0xce;
              goto LAB_0015b84d;
            }
            sVar18 = *(short *)(lVar3 + 0xd0 + lVar25);
            sVar29 = *(short *)(d->m_dict + lVar25 + uVar16 + 8);
            if (sVar18 != sVar29) {
              iVar17 = iVar17 + iVar12 + 0xd0;
              goto LAB_0015b84d;
            }
            lVar25 = lVar25 + 8;
            uVar23 = uVar13;
            if ((int)lVar25 == 0x100) goto LAB_0015b8b3;
          }
          iVar17 = iVar17 + iVar12 + 0xca;
LAB_0015b84d:
          uVar21 = (uint)((char)sVar18 == (char)sVar29) | iVar17 - local_48 & 0xfffffffeU;
        } while (uVar21 <= uVar30);
        uVar23 = uVar13;
        uVar30 = uVar21;
        local_9c = uVar26;
      } while (uVar21 < uVar13);
    }
    else if ((uVar31 >> 0x13 & 1) == 0 && uVar19 != 0) {
      if (uVar13 == 0) {
        uVar23 = 0;
      }
      else {
        uVar16 = 0;
        do {
          uVar23 = (uint)uVar16;
          if (pmVar2[uVar28 + (uint)uVar16] != pmVar2[uVar10 - 1 & 0x7fff]) break;
          uVar16 = uVar16 + 1;
          uVar23 = uVar13;
        } while (uVar13 != uVar16);
      }
      uVar27 = (uint)(2 < uVar23);
      if (2 >= uVar23) {
        uVar23 = 0;
      }
    }
    else {
LAB_0015b88a:
      uVar27 = 0;
      uVar23 = uVar30;
    }
LAB_0015b8b3:
    if (((uVar23 == 3 && 0x1fff < uVar27) || (uVar28 == uVar27)) ||
       (((uVar31 >> 0x11 & 1) != 0 && (uVar23 < 6)))) {
      if (uVar14 != 0) {
LAB_0015b8eb:
        if ((uVar14 < 3) || (uVar13 = d->m_saved_match_dist - 1, 0x7fff < uVar13)) {
LAB_0015bcd4:
          __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                        ,0x6a0,"void tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)");
        }
        d->m_total_lz_bytes = d->m_total_lz_bytes + uVar14;
        *d->m_pLZ_code_buf = (mz_uint8)(uVar14 - 3);
        d->m_pLZ_code_buf[1] = (mz_uint8)uVar13;
        d->m_pLZ_code_buf[2] = (mz_uint8)(uVar13 >> 8);
        d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
        *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
        pmVar1 = &d->m_num_flags_left;
        *pmVar1 = *pmVar1 - 1;
        if (*pmVar1 == 0) {
          d->m_num_flags_left = 8;
          pmVar11 = d->m_pLZ_code_buf;
          d->m_pLZ_code_buf = pmVar11 + 1;
          d->m_pLZ_flags = pmVar11;
        }
        pbVar15 = "" + (uVar13 >> 8);
        if (uVar13 < 0x200) {
          pbVar15 = "" + (uVar13 & 0x1ff);
        }
        pmVar4 = d->m_huff_count[1] + *pbVar15;
        *pmVar4 = *pmVar4 + 1;
        pmVar4 = d->m_huff_count[0] + s_tdefl_len_sym[uVar14 - 3];
        *pmVar4 = *pmVar4 + 1;
        uVar23 = d->m_saved_match_len - 1;
        goto LAB_0015b99f;
      }
LAB_0015bb7d:
      bVar6 = d->m_dict[uVar24];
      d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
      pbVar15 = d->m_pLZ_code_buf;
      d->m_pLZ_code_buf = pbVar15 + 1;
      *pbVar15 = bVar6;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar11 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar11 + 1;
        d->m_pLZ_flags = pmVar11;
      }
      pmVar4 = d->m_huff_count[0] + bVar6;
      *pmVar4 = *pmVar4 + 1;
LAB_0015bbc1:
      uVar23 = 1;
    }
    else if (uVar14 == 0) {
      if (uVar27 == 0) goto LAB_0015bb7d;
      if (((d->m_greedy_parsing == 0) && ((uVar31 >> 0x10 & 1) == 0)) && (uVar23 < 0x80))
      goto LAB_0015bc5b;
      if ((0x8000 < uVar27) || (uVar23 < 3)) goto LAB_0015bcd4;
      uVar13 = uVar27 - 1;
      d->m_total_lz_bytes = d->m_total_lz_bytes + uVar23;
      *d->m_pLZ_code_buf = (mz_uint8)(uVar23 - 3);
      d->m_pLZ_code_buf[1] = (mz_uint8)uVar13;
      d->m_pLZ_code_buf[2] = (mz_uint8)(uVar13 >> 8);
      d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar11 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar11 + 1;
        d->m_pLZ_flags = pmVar11;
      }
      pbVar15 = "" + (uVar13 >> 8);
      if (uVar27 < 0x201) {
        pbVar15 = "" + (uVar13 & 0x1ff);
      }
      pmVar4 = d->m_huff_count[1] + *pbVar15;
      *pmVar4 = *pmVar4 + 1;
      pmVar4 = d->m_huff_count[0] + s_tdefl_len_sym[uVar23 - 3];
      *pmVar4 = *pmVar4 + 1;
    }
    else {
      if (uVar23 <= uVar14) goto LAB_0015b8eb;
      uVar13 = d->m_saved_lit;
      d->m_total_lz_bytes = d->m_total_lz_bytes + 1;
      pmVar11 = d->m_pLZ_code_buf;
      d->m_pLZ_code_buf = pmVar11 + 1;
      *pmVar11 = (mz_uint8)uVar13;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar11 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar11 + 1;
        d->m_pLZ_flags = pmVar11;
      }
      pmVar4 = d->m_huff_count[0] + (uVar13 & 0xff);
      *pmVar4 = *pmVar4 + 1;
      if (uVar23 < 0x80) {
LAB_0015bc5b:
        d->m_saved_lit = (uint)d->m_dict[uVar24];
        d->m_saved_match_dist = uVar27;
        d->m_saved_match_len = uVar23;
        goto LAB_0015bbc1;
      }
      uVar27 = uVar27 - 1;
      if (0x7fff < uVar27) goto LAB_0015bcd4;
      d->m_total_lz_bytes = d->m_total_lz_bytes + uVar23;
      *d->m_pLZ_code_buf = (mz_uint8)(uVar23 - 3);
      d->m_pLZ_code_buf[1] = (mz_uint8)uVar27;
      d->m_pLZ_code_buf[2] = (mz_uint8)(uVar27 >> 8);
      d->m_pLZ_code_buf = d->m_pLZ_code_buf + 3;
      *d->m_pLZ_flags = *d->m_pLZ_flags >> 1 | 0x80;
      pmVar1 = &d->m_num_flags_left;
      *pmVar1 = *pmVar1 - 1;
      if (*pmVar1 == 0) {
        d->m_num_flags_left = 8;
        pmVar11 = d->m_pLZ_code_buf;
        d->m_pLZ_code_buf = pmVar11 + 1;
        d->m_pLZ_flags = pmVar11;
      }
      pbVar15 = "" + (uVar27 >> 8);
      if (uVar27 < 0x200) {
        pbVar15 = "" + (uVar27 & 0x1ff);
      }
      pmVar4 = d->m_huff_count[1] + *pbVar15;
      *pmVar4 = *pmVar4 + 1;
      pmVar4 = d->m_huff_count[0] + s_tdefl_len_sym[uVar23 - 3];
      *pmVar4 = *pmVar4 + 1;
LAB_0015b99f:
      d->m_saved_match_len = 0;
    }
    d->m_lookahead_pos = d->m_lookahead_pos + uVar23;
    if (d->m_lookahead_size < uVar23) {
      __assert_fail("d->m_lookahead_size >= len_to_move",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                    ,0x737,"mz_bool tdefl_compress_normal(tdefl_compressor *)");
    }
    d->m_lookahead_size = d->m_lookahead_size - uVar23;
    uVar23 = uVar23 + d->m_dict_size;
    if (0x7fff < uVar23) {
      uVar23 = 0x8000;
    }
    d->m_dict_size = uVar23;
    if ((d->m_lz_code_buf + 0xfff8 < d->m_pLZ_code_buf) ||
       ((0x7c00 < d->m_total_lz_bytes &&
        ((d->m_total_lz_bytes <= (uint)(((int)d->m_pLZ_code_buf - local_40) * 0x73) >> 7 ||
         ((d->m_flags & 0x80000) != 0)))))) {
      d->m_pSrc = pbVar32;
      d->m_src_buf_left = local_98;
      uVar13 = tdefl_flush_block(d,0);
      if (uVar13 != 0) {
        return ~uVar13 >> 0x1f;
      }
    }
  } while( true );
}

Assistant:

static mz_bool tdefl_compress_normal(tdefl_compressor *d)
{
    const mz_uint8 *pSrc = d->m_pSrc;
    size_t src_buf_left = d->m_src_buf_left;
    tdefl_flush flush = d->m_flush;

    while ((src_buf_left) || ((flush) && (d->m_lookahead_size)))
    {
        mz_uint len_to_move, cur_match_dist, cur_match_len, cur_pos;
        /* Update dictionary and hash chains. Keeps the lookahead size equal to TDEFL_MAX_MATCH_LEN. */
        if ((d->m_lookahead_size + d->m_dict_size) >= (TDEFL_MIN_MATCH_LEN - 1))
        {
            mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK, ins_pos = d->m_lookahead_pos + d->m_lookahead_size - 2;
            mz_uint hash = (d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK];
            mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(src_buf_left, TDEFL_MAX_MATCH_LEN - d->m_lookahead_size);
            const mz_uint8 *pSrc_end = pSrc + num_bytes_to_process;
            src_buf_left -= num_bytes_to_process;
            d->m_lookahead_size += num_bytes_to_process;
            while (pSrc != pSrc_end)
            {
                mz_uint8 c = *pSrc++;
                d->m_dict[dst_pos] = c;
                if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                    d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
                hash = ((hash << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
                d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
                d->m_hash[hash] = (mz_uint16)(ins_pos);
                dst_pos = (dst_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
                ins_pos++;
            }
        }
        else
        {
            while ((src_buf_left) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
            {
                mz_uint8 c = *pSrc++;
                mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK;
                src_buf_left--;
                d->m_dict[dst_pos] = c;
                if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                    d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
                if ((++d->m_lookahead_size + d->m_dict_size) >= TDEFL_MIN_MATCH_LEN)
                {
                    mz_uint ins_pos = d->m_lookahead_pos + (d->m_lookahead_size - 1) - 2;
                    mz_uint hash = ((d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] << (TDEFL_LZ_HASH_SHIFT * 2)) ^ (d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK] << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
                    d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
                    d->m_hash[hash] = (mz_uint16)(ins_pos);
                }
            }
        }
        d->m_dict_size = MZ_MIN(TDEFL_LZ_DICT_SIZE - d->m_lookahead_size, d->m_dict_size);
        if ((!flush) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
            break;

        /* Simple lazy/greedy parsing state machine. */
        len_to_move = 1;
        cur_match_dist = 0;
        cur_match_len = d->m_saved_match_len ? d->m_saved_match_len : (TDEFL_MIN_MATCH_LEN - 1);
        cur_pos = d->m_lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;
        if (d->m_flags & (TDEFL_RLE_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS))
        {
            if ((d->m_dict_size) && (!(d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS)))
            {
                mz_uint8 c = d->m_dict[(cur_pos - 1) & TDEFL_LZ_DICT_SIZE_MASK];
                cur_match_len = 0;
                while (cur_match_len < d->m_lookahead_size)
                {
                    if (d->m_dict[cur_pos + cur_match_len] != c)
                        break;
                    cur_match_len++;
                }
                if (cur_match_len < TDEFL_MIN_MATCH_LEN)
                    cur_match_len = 0;
                else
                    cur_match_dist = 1;
            }
        }
        else
        {
            tdefl_find_match(d, d->m_lookahead_pos, d->m_dict_size, d->m_lookahead_size, &cur_match_dist, &cur_match_len);
        }
        if (((cur_match_len == TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 8U * 1024U)) || (cur_pos == cur_match_dist) || ((d->m_flags & TDEFL_FILTER_MATCHES) && (cur_match_len <= 5)))
        {
            cur_match_dist = cur_match_len = 0;
        }
        if (d->m_saved_match_len)
        {
            if (cur_match_len > d->m_saved_match_len)
            {
                tdefl_record_literal(d, (mz_uint8)d->m_saved_lit);
                if (cur_match_len >= 128)
                {
                    tdefl_record_match(d, cur_match_len, cur_match_dist);
                    d->m_saved_match_len = 0;
                    len_to_move = cur_match_len;
                }
                else
                {
                    d->m_saved_lit = d->m_dict[cur_pos];
                    d->m_saved_match_dist = cur_match_dist;
                    d->m_saved_match_len = cur_match_len;
                }
            }
            else
            {
                tdefl_record_match(d, d->m_saved_match_len, d->m_saved_match_dist);
                len_to_move = d->m_saved_match_len - 1;
                d->m_saved_match_len = 0;
            }
        }
        else if (!cur_match_dist)
            tdefl_record_literal(d, d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)]);
        else if ((d->m_greedy_parsing) || (d->m_flags & TDEFL_RLE_MATCHES) || (cur_match_len >= 128))
        {
            tdefl_record_match(d, cur_match_len, cur_match_dist);
            len_to_move = cur_match_len;
        }
        else
        {
            d->m_saved_lit = d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)];
            d->m_saved_match_dist = cur_match_dist;
            d->m_saved_match_len = cur_match_len;
        }
        /* Move the lookahead forward by len_to_move bytes. */
        d->m_lookahead_pos += len_to_move;
        MZ_ASSERT(d->m_lookahead_size >= len_to_move);
        d->m_lookahead_size -= len_to_move;
        d->m_dict_size = MZ_MIN(d->m_dict_size + len_to_move, (mz_uint)TDEFL_LZ_DICT_SIZE);
        /* Check if it's time to flush the current LZ codes to the internal output buffer. */
        if ((d->m_pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8]) ||
            ((d->m_total_lz_bytes > 31 * 1024) && (((((mz_uint)(d->m_pLZ_code_buf - d->m_lz_code_buf) * 115) >> 7) >= d->m_total_lz_bytes) || (d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS))))
        {
            int n;
            d->m_pSrc = pSrc;
            d->m_src_buf_left = src_buf_left;
            if ((n = tdefl_flush_block(d, 0)) != 0)
                return (n < 0) ? MZ_FALSE : MZ_TRUE;
        }
    }

    d->m_pSrc = pSrc;
    d->m_src_buf_left = src_buf_left;
    return MZ_TRUE;
}